

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfArray.h
# Opt level: O0

void __thiscall
Imf_3_4::Array<Imf_3_4::Array2D<float_*>_>::Array(Array<Imf_3_4::Array2D<float_*>_> *this,long size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong *puVar3;
  Array2D<float_*> *pAVar4;
  ulong in_RSI;
  ulong *in_RDI;
  ulong uVar5;
  Array2D<float_*> *local_50;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_RSI;
  uVar2 = SUB168(auVar1 * ZEXT816(0x18),0);
  uVar5 = uVar2 + 8;
  if (SUB168(auVar1 * ZEXT816(0x18),8) != 0 || 0xfffffffffffffff7 < uVar2) {
    uVar5 = 0xffffffffffffffff;
  }
  puVar3 = (ulong *)operator_new__(uVar5);
  *puVar3 = in_RSI;
  pAVar4 = (Array2D<float_*> *)(puVar3 + 1);
  if (in_RSI != 0) {
    local_50 = pAVar4;
    do {
      Array2D<float_*>::Array2D(local_50);
      local_50 = local_50 + 1;
    } while (local_50 != pAVar4 + in_RSI);
  }
  in_RDI[1] = (ulong)pAVar4;
  *in_RDI = in_RSI;
  return;
}

Assistant:

Array (long size)
    {
        _data = new T[size];
        _size = size;
    }